

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O1

int ztransform(uint8_t *msg,uint32_t *h)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  uint auStack_178 [9];
  int local_154 [5];
  uint local_140 [68];
  
  lVar1 = 0;
  do {
    uVar11 = *(uint *)(msg + lVar1 * 4);
    local_140[lVar1 + 2] =
         uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  lVar1 = 0x10;
  do {
    uVar11 = local_140[lVar1];
    uVar8 = auStack_178[lVar1 + 1];
    local_140[lVar1 + 2] =
         (uVar11 >> 10 ^ (uVar11 << 0xd | uVar11 >> 0x13) ^ (uVar11 << 0xf | uVar11 >> 0x11)) +
         local_154[lVar1] + auStack_178[lVar1] +
         (uVar8 >> 3 ^ (uVar8 << 0xe | uVar8 >> 0x12) ^ (uVar8 << 0x19 | uVar8 >> 7));
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x40);
  lVar1 = 0;
  uVar10 = *h;
  uVar9 = h[1];
  uVar11 = h[2];
  uVar8 = h[3];
  uVar7 = h[4];
  uVar6 = h[5];
  uVar5 = h[6];
  uVar12 = h[7];
  do {
    uVar3 = uVar5;
    uVar5 = uVar6;
    uVar6 = uVar7;
    uVar2 = uVar11;
    uVar11 = uVar9;
    uVar9 = uVar10;
    iVar4 = ((uVar5 ^ uVar3) & uVar6 ^ uVar3) + uVar12 +
            ((uVar6 << 7 | uVar6 >> 0x19) ^
            (uVar6 << 0x15 | uVar6 >> 0xb) ^ (uVar6 << 0x1a | uVar6 >> 6)) +
            *(int *)((long)k + lVar1) + *(int *)((long)local_140 + lVar1 + 8);
    uVar7 = uVar8 + iVar4;
    uVar10 = (uVar11 & uVar2 ^ (uVar11 ^ uVar2) & uVar9) +
             ((uVar9 << 10 | uVar9 >> 0x16) ^
             (uVar9 << 0x13 | uVar9 >> 0xd) ^ (uVar9 << 0x1e | uVar9 >> 2)) + iVar4;
    lVar1 = lVar1 + 4;
    uVar8 = uVar2;
    uVar12 = uVar3;
  } while (lVar1 != 0x100);
  *h = uVar10 + *h;
  h[1] = uVar9 + h[1];
  h[2] = uVar11 + h[2];
  h[3] = uVar2 + h[3];
  h[4] = uVar7 + h[4];
  uVar10 = uVar6 + h[5];
  h[5] = uVar10;
  h[6] = uVar5 + h[6];
  h[7] = uVar3 + h[7];
  return uVar10;
}

Assistant:

static int ztransform(const uint8_t *msg, uint32_t *h)
{
    uint32_t w[64];
    uint32_t a0, b1, c2, d3, e4, f5, g6, h7;
    uint32_t t1, t2;

    int i = 0;
    int j = 0;

    for (i=0; i<16; i++) {
        w[i] = msg[j]<<24 | msg[j+1]<<16 | msg[j+2]<<8 | msg[j+3];
        j += 4;
    }

    for(i=16; i<64; i++){
        w[i] = SSIG1(w[i-2])+w[i-7]+SSIG0(w[i-15])+w[i-16];
    }

    zdump_hex((uint8_t*)w, 64*4);

    a0 = h[0];
    b1 = h[1];
    c2 = h[2];
    d3 = h[3];
    e4 = h[4];
    f5 = h[5];
    g6 = h[6];
    h7 = h[7];

    for (i= 0; i<64; i++) {
        t1 = h7 + BSIG1(e4) + CHX(e4, f5, g6) + k[i] + w[i];
        t2 = BSIG0(a0) + MAJ(a0, b1, c2);

        h7 = g6;
        g6 = f5;
        f5 = e4;
        e4 = d3 + t1;
        d3 = c2;
        c2 = b1;
        b1 = a0;
        a0 = t1 + t2;
    }

    h[0] += a0;
    h[1] += b1;
    h[2] += c2;
    h[3] += d3;
    h[4] += e4;
    h[5] += f5;
    h[6] += g6;
    h[7] += h7;

    return 0;
}